

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<double>::internalSetData<std::pair<int,int>>(Parameter<double> *this,pair<int,_int> data)

{
  bool bVar1;
  pair<int,_int> in_RSI;
  long in_RDI;
  bool result;
  double tmp;
  RepType local_18 [3];
  
  local_18[0] = 0.0;
  bVar1 = ParameterTraits<double>::convert<std::pair<int,int>>(in_RSI,local_18);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(RepType *)(in_RDI + 0x30) = local_18[0];
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }